

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O0

void __thiscall
sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::erasenonleaf
          (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this,int *cur,
          node **p,int *pp,locType *pos)

{
  uint uVar1;
  node *pnVar2;
  undefined8 uVar3;
  DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
  *pDVar4;
  _func_int *p_Var5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar7;
  unsigned_long_long uVar8;
  long lVar9;
  node **ppnVar10;
  undefined8 uStackY_90;
  unsigned_long_long local_88 [2];
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *local_78;
  undefined8 local_70;
  unsigned_long_long old;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  uint local_50;
  int local_4c;
  int newsz;
  node **y;
  int j;
  int i;
  node **x;
  locType *pos_local;
  int *pp_local;
  node **p_local;
  int *cur_local;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_local;
  
  _j = p + *cur;
  y._0_4_ = pp[*cur];
  iVar6 = (int)y;
  while (y._4_4_ = iVar6 + 1, y._4_4_ < (*_j)->sz) {
    (*_j)->keyvalue[iVar6] = (*_j)->keyvalue[y._4_4_];
    ((*_j)->field_0).val[y._4_4_] = ((*_j)->field_0).val[iVar6 + 2];
    iVar6 = y._4_4_;
  }
  (*_j)->sz = (*_j)->sz + -1;
  local_78 = this;
  x = (node **)pos;
  pos_local = (locType *)pp;
  pp_local = (int *)p;
  p_local = (node **)cur;
  cur_local = &this->depth;
  if (*cur == 0) {
    if ((*_j)->sz == 0) {
      this->depth = this->depth + -1;
      uStackY_90 = 0x111b59;
      DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
      ::release((DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                 *)__vla_expr1,old);
      local_78->root = (locType)x[1];
    }
    else {
      uStackY_90 = 0x111b7d;
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
        )._vptr_FileManager_Base[3])(this->file,pos);
    }
  }
  else if ((*_j)->sz < 0x31) {
    if (pp[*cur + -1] == p[*cur + -1]->sz) {
      p[*cur + 1] = p[*cur];
      pp[*cur + 1] = pp[*cur + -1];
      pos[*cur + 1] = pos[*cur];
      pp[*cur + -1] = p[*cur + -1]->sz + -1;
      pos[*cur] = (p[*cur + -1]->field_0).val[pp[*cur + -1]];
      uStackY_90 = 0x111ce1;
      iVar6 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[2])(this->file,pos + *cur);
      *(ulong *)(pp_local + (long)*(int *)p_local * 2) = CONCAT44(extraout_var,iVar6);
    }
    else {
      pp[*cur + 1] = pp[*cur + -1] + 1;
      pos[*cur + 1] = (p[*cur + -1]->field_0).val[pp[*cur + 1]];
      uStackY_90 = 0x111d85;
      iVar6 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[2])(this->file,pos + (*cur + 1));
      *(ulong *)(pp_local + (long)(*(int *)p_local + 1) * 2) = CONCAT44(extraout_var_00,iVar6);
    }
    plVar7 = (long *)(pp_local + (long)(*(int *)p_local + 1) * 2);
    _newsz = plVar7;
    if ((*_j)->sz + *(int *)(*plVar7 + 0x640) < 99) {
      (*_j)->keyvalue[(*_j)->sz] =
           *(unsigned_long_long *)
            (*(long *)(pp_local + (long)(*(int *)p_local + -1) * 2) + 0x328 +
            (long)*(int *)((long)pos_local + (long)(*(int *)p_local + -1) * 4) * 8);
      for (y._4_4_ = 0; y._4_4_ < *(int *)(*plVar7 + 0x640); y._4_4_ = y._4_4_ + 1) {
        ((*_j)->field_0).val[(*_j)->sz + 1 + y._4_4_] = *(long *)(*plVar7 + (long)y._4_4_ * 8);
        (*_j)->keyvalue[(*_j)->sz + 1 + y._4_4_] =
             *(unsigned_long_long *)(*plVar7 + 0x328 + (long)y._4_4_ * 8);
      }
      lVar9 = *(long *)(*plVar7 + (long)*(int *)(*plVar7 + 0x640) * 8);
      pnVar2 = *_j;
      iVar6 = *(int *)(*plVar7 + 0x640) + 1 + (*_j)->sz;
      (*_j)->sz = iVar6;
      (pnVar2->field_0).val[iVar6] = lVar9;
      uStackY_90 = 0x111f20;
      (*(local_78->file->
        super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
        )._vptr_FileManager_Base[3])(local_78->file,x + *(int *)p_local);
      uStackY_90 = 0x111f41;
      DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
      ::release((DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                 *)__vla_expr1,old);
      local_4c = *(int *)p_local + -1;
      uStackY_90 = 0x111f66;
      erasenonleaf(local_78,&local_4c,(node **)pp_local,(int *)pos_local,(locType *)x);
    }
    else {
      uVar1 = (*_j)->sz + 1 + *(int *)(*plVar7 + 0x640);
      uVar8 = (long)local_88 - ((ulong)(uVar1 + 1) * 8 + 0xf & 0xfffffffffffffff0);
      lVar9 = uVar8 - ((ulong)uVar1 * 8 + 0xf & 0xfffffffffffffff0);
      uVar3 = *(undefined8 *)(*plVar7 + 0x328);
      for (y._4_4_ = 0; y._4_4_ < (*_j)->sz; y._4_4_ = y._4_4_ + 1) {
        *(long *)(uVar8 + (long)y._4_4_ * 8) = ((*_j)->field_0).val[y._4_4_];
        *(unsigned_long_long *)(lVar9 + (long)y._4_4_ * 8) = (*_j)->keyvalue[y._4_4_];
      }
      *(long *)(uVar8 + (long)(*_j)->sz * 8) = ((*_j)->field_0).val[(*_j)->sz];
      *(undefined8 *)(lVar9 + (long)(*_j)->sz * 8) =
           *(undefined8 *)
            (*(long *)(pp_local + (long)(*(int *)p_local + -1) * 2) + 0x328 +
            (long)*(int *)((long)pos_local + (long)(*(int *)p_local + -1) * 4) * 8);
      y._4_4_ = (*_j)->sz;
      while (y._4_4_ = y._4_4_ + 1, y._4_4_ < (int)uVar1) {
        *(undefined8 *)(uVar8 + (long)y._4_4_ * 8) =
             *(undefined8 *)(*plVar7 + (long)((y._4_4_ - (*_j)->sz) + -1) * 8);
        *(undefined8 *)(lVar9 + (long)y._4_4_ * 8) =
             *(undefined8 *)(*plVar7 + 0x328 + (long)((y._4_4_ - (*_j)->sz) + -1) * 8);
      }
      *(undefined8 *)(uVar8 + (long)(int)uVar1 * 8) =
           *(undefined8 *)(*plVar7 + (long)*(int *)(*plVar7 + 0x640) * 8);
      (*_j)->sz = (int)uVar1 >> 1;
      *(uint *)(*plVar7 + 0x640) = (uVar1 - (*_j)->sz) + -1;
      for (y._4_4_ = 0; y._4_4_ < (*_j)->sz; y._4_4_ = y._4_4_ + 1) {
        ((*_j)->field_0).val[y._4_4_] = *(long *)(uVar8 + (long)y._4_4_ * 8);
        (*_j)->keyvalue[y._4_4_] = *(unsigned_long_long *)(lVar9 + (long)y._4_4_ * 8);
      }
      ((*_j)->field_0).val[(*_j)->sz] = *(long *)(uVar8 + (long)(*_j)->sz * 8);
      *(undefined8 *)
       (*(long *)(pp_local + (long)(*(int *)p_local + -1) * 2) + 0x328 +
       (long)*(int *)((long)pos_local + (long)(*(int *)p_local + -1) * 4) * 8) =
           *(undefined8 *)(lVar9 + (long)(*_j)->sz * 8);
      for (y._4_4_ = 0; y._4_4_ < *(int *)(*plVar7 + 0x640); y._4_4_ = y._4_4_ + 1) {
        *(undefined8 *)(*plVar7 + (long)y._4_4_ * 8) =
             *(undefined8 *)(uVar8 + (long)(y._4_4_ + (*_j)->sz + 1) * 8);
        *(undefined8 *)(*plVar7 + 0x328 + (long)y._4_4_ * 8) =
             *(undefined8 *)(lVar9 + (long)(y._4_4_ + (*_j)->sz + 1) * 8);
      }
      *(undefined8 *)(*plVar7 + (long)*(int *)(*plVar7 + 0x640) * 8) =
           *(undefined8 *)(uVar8 + (long)(int)uVar1 * 8);
      pDVar4 = local_78->file;
      ppnVar10 = x + *(int *)p_local;
      p_Var5 = (pDVar4->
               super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
               )._vptr_FileManager_Base[3];
      local_88[0] = uVar8;
      local_88[1] = lVar9;
      local_70 = uVar3;
      old = (ulong)uVar1;
      __vla_expr1 = (ulong)(uVar1 + 1);
      __vla_expr0 = (unsigned_long)local_88;
      local_50 = uVar1;
      *(undefined8 *)(lVar9 + -8) = 0x112333;
      (*p_Var5)(pDVar4,ppnVar10);
      pDVar4 = local_78->file;
      ppnVar10 = x + (*(int *)p_local + 1);
      p_Var5 = (pDVar4->
               super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
               )._vptr_FileManager_Base[3];
      *(undefined8 *)(lVar9 + -8) = 0x112357;
      (*p_Var5)(pDVar4,ppnVar10);
      pDVar4 = local_78->file;
      ppnVar10 = x + (*(int *)p_local + -1);
      p_Var5 = (pDVar4->
               super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
               )._vptr_FileManager_Base[3];
      *(undefined8 *)(lVar9 + -8) = 0x11237b;
      (*p_Var5)(pDVar4,ppnVar10);
    }
  }
  else {
    uStackY_90 = 0x111bb2;
    (*(this->file->
      super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
      )._vptr_FileManager_Base[3])(this->file,pos + *cur);
  }
  return;
}

Assistant:

void erasenonleaf(const int &cur, node **p, int *pp, locType *pos) {
            node *&x = p[cur];
            int i, j = pp[cur];
            for (i = j + 1; i < x->sz; ++i)x->keyvalue[i - 1] = x->keyvalue[i], x->pointer[i] = x->pointer[i + 1];
            --x->sz;
            if (!cur) {
                if (!x->sz) {
                    --depth;
                    file->release(root);
                    root = pos[1];
                } else {
                    file->save(pos[0]);
                }
                return;
            }
            if (x->sz >= degree - 1 >> 1) {
                file->save(pos[cur]);
                return;
            }
            if (pp[cur - 1] == p[cur - 1]->sz) {
                p[cur + 1] = p[cur];
                pp[cur + 1] = pp[cur - 1];
                pos[cur + 1] = pos[cur];
                pp[cur - 1] = p[cur - 1]->sz - 1;
                pos[cur] = p[cur - 1]->pointer[pp[cur - 1]];
                p[cur] = file->read(pos[cur]);
            } else {
                pp[cur + 1] = pp[cur - 1] + 1;
                pos[cur + 1] = p[cur - 1]->pointer[pp[cur + 1]];
                p[cur + 1] = file->read(pos[cur + 1]);
            }
            node *&y = p[cur + 1];
            if (x->sz + y->sz < degree - 1) {
                x->keyvalue[x->sz] = p[cur - 1]->keyvalue[pp[cur - 1]];
                for (i = 0; i < y->sz; ++i)
                    x->pointer[x->sz + 1 + i] = y->pointer[i], x->keyvalue[x->sz + 1 + i] = y->keyvalue[i];
                x->pointer[x->sz += 1 + y->sz] = y->pointer[y->sz];
                file->save(pos[cur]);
                file->release(pos[cur + 1]);
                erasenonleaf(cur - 1, p, pp, pos);
            } else {
                int newsz = x->sz + y->sz + 1;
                locType tmpp[newsz + 1];
                Key tmpk[newsz], old = y->keyvalue[0];
                for (i = 0; i < x->sz; ++i)tmpp[i] = x->pointer[i], tmpk[i] = x->keyvalue[i];
                tmpp[x->sz] = x->pointer[x->sz];
                tmpk[x->sz] = p[cur - 1]->keyvalue[pp[cur - 1]];
                for (i = x->sz + 1; i < newsz; ++i)
                    tmpp[i] = y->pointer[i - x->sz - 1], tmpk[i] = y->keyvalue[i - x->sz - 1];
                tmpp[newsz] = y->pointer[y->sz];
                x->sz = newsz >> 1;
                y->sz = newsz - x->sz - 1;
                for (i = 0; i < x->sz; ++i)x->pointer[i] = tmpp[i], x->keyvalue[i] = tmpk[i];
                x->pointer[x->sz] = tmpp[x->sz];
                p[cur - 1]->keyvalue[pp[cur - 1]] = tmpk[x->sz];
                for (i = 0; i < y->sz; ++i)y->pointer[i] = tmpp[i + x->sz + 1], y->keyvalue[i] = tmpk[i + x->sz + 1];
                y->pointer[y->sz] = tmpp[newsz];
                file->save(pos[cur]);
                file->save(pos[cur + 1]);
                file->save(pos[cur - 1]);
            }
        }